

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QRect __thiscall QTableViewPrivate::visualSpanRect(QTableViewPrivate *this,Span *span)

{
  QWidget *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  QRect QVar8;
  
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  iVar6 = span->m_top;
  iVar3 = QHeaderView::sectionViewportPosition(this->verticalHeader,iVar6);
  iVar4 = rowSpanHeight(this,iVar6,(span->m_bottom - span->m_top) + 1);
  iVar6 = span->m_left;
  iVar5 = columnSpanWidth(this,iVar6,(span->m_right - iVar6) + 1);
  bVar1 = QWidget::isRightToLeft(this_00);
  if (bVar1) {
    iVar6 = span->m_right;
  }
  iVar6 = QHeaderView::sectionViewportPosition(this->horizontalHeader,iVar6);
  bVar1 = this->showGrid;
  bVar2 = QWidget::isRightToLeft(this_00);
  uVar7 = ~(uint)bVar1;
  if (bVar2) {
    iVar6 = iVar6 + (uint)bVar1;
    iVar5 = iVar5 + uVar7 + iVar6;
  }
  else {
    iVar5 = iVar5 + iVar6 + uVar7;
  }
  QVar8.y1.m_i = iVar3;
  QVar8.x1.m_i = iVar6;
  QVar8.y2.m_i = uVar7 + iVar4 + iVar3;
  QVar8.x2.m_i = iVar5;
  return QVar8;
}

Assistant:

QRect QTableViewPrivate::visualSpanRect(const QSpanCollection::Span &span) const
{
    Q_Q(const QTableView);
    // vertical
    int row = span.top();
    int rowp = verticalHeader->sectionViewportPosition(row);
    int rowh = rowSpanHeight(row, span.height());
    // horizontal
    int column = span.left();
    int colw = columnSpanWidth(column, span.width());
    if (q->isRightToLeft())
        column = span.right();
    int colp = horizontalHeader->sectionViewportPosition(column);

    const int i = showGrid ? 1 : 0;
    if (q->isRightToLeft())
        return QRect(colp + i, rowp, colw - i, rowh - i);
    return QRect(colp, rowp, colw - i, rowh - i);
}